

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ItemSimilarityRecommender_ConnectedItem::SharedCtor
          (ItemSimilarityRecommender_ConnectedItem *this)

{
  ItemSimilarityRecommender_ConnectedItem *this_local;
  
  memset(&this->itemid_,0,0x10);
  this->_cached_size_ = 0;
  return;
}

Assistant:

void ItemSimilarityRecommender_ConnectedItem::SharedCtor() {
  ::memset(&itemid_, 0, reinterpret_cast<char*>(&similarityscore_) -
    reinterpret_cast<char*>(&itemid_) + sizeof(similarityscore_));
  _cached_size_ = 0;
}